

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void linsolve(double *A,int N,double *b,int *ipiv,double *x)

{
  double *__ptr;
  double *pdVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  lVar5 = (long)N;
  __ptr = (double *)malloc(lVar5 * 8);
  uVar6 = 0;
  if (0 < N) {
    uVar6 = (ulong)(uint)N;
  }
  iVar4 = 0;
  for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    __ptr[uVar7] = 0.0;
    x[uVar7] = 0.0;
    if ((A[iVar4] == 0.0) && (!NAN(A[iVar4]))) {
      printf("Warning : The Matrix system does not have a unique solution");
    }
    iVar4 = iVar4 + N + 1;
  }
  *__ptr = b[*ipiv];
  pdVar1 = A + lVar5;
  for (lVar2 = 1; lVar2 < lVar5; lVar2 = lVar2 + 1) {
    dVar8 = 0.0;
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
      dVar8 = dVar8 + __ptr[lVar3] * pdVar1[lVar3];
    }
    __ptr[lVar2] = b[ipiv[lVar2]] - dVar8;
    pdVar1 = pdVar1 + lVar5;
  }
  iVar4 = N + -1;
  x[iVar4] = __ptr[iVar4] / A[(ulong)(uint)(N * N) - 1];
  uVar6 = (ulong)(N + -2);
  lVar5 = (long)(N + 1);
  pdVar1 = A + uVar6 * lVar5 + 1;
  for (; -1 < (long)uVar6; uVar6 = uVar6 - 1) {
    dVar8 = 0.0;
    for (lVar2 = 0; iVar4 + (int)lVar2 < N; lVar2 = lVar2 + 1) {
      dVar8 = dVar8 + pdVar1[lVar2] * x[(uVar6 & 0xffffffff) + lVar2 + 1];
    }
    x[uVar6] = (__ptr[uVar6] - dVar8) / A[uVar6 * lVar5];
    pdVar1 = pdVar1 + -lVar5;
    iVar4 = iVar4 + -1;
  }
  free(__ptr);
  return;
}

Assistant:

void linsolve(double *A,int N,double *b,int *ipiv,double *x) {
	int i,j,c1,l;
	double *y;
	double sum;
	
	y = (double*) malloc(sizeof(double) *N);
	/*
	 * Two step Solution L * U * x = b
	 * Let U*x = y
	 * Solve L * y = b for y (Forward Substitution
	 * Solve U * x = b for x (Back Substitution)
	 */ 
	for(i = 0; i < N;++i) {
		y[i] = 0.;
		x[i] = 0.;
		if ( A[i*N + i] == 0.) {
			printf("Warning : The Matrix system does not have a unique solution");
			//exit(1);
		}
		//printf("\n B %d",ipiv[i]);
	}
	
	// Forward Substitution
	
	y[0] = b[ipiv[0]];
	for(i = 1; i < N; ++i) {
		sum = 0.;
		c1 = i*N;
		for(j = 0; j < i; ++j) {
			sum += y[j] * A[c1 + j];
		}
		y[i] = b[ipiv[i]] - sum;
	}
	
	// Back Substitution
	
	x[N - 1] = y[N - 1]/A[N * N - 1];
	
	for (i = N - 2; i >= 0; i--) {
		sum = 0.;
		c1 = i*(N+1);
		l=0;
		for(j = i+1; j < N;j++) {
			l++;
			sum += A[c1 + l] * x[j];
		}
		x[i] = (y[i] - sum) / A[c1];
	}
	
	free(y);
}